

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O2

CURLcode libcurl_generate_mime(CURL *curl,GlobalConfig *config,tool_mime *toolmime,int *mimeno)

{
  CURLcode CVar1;
  int mimeno_00;
  tool_mime *part;
  
  mimeno_00 = (int)mimeno;
  easysrc_mime_count = easysrc_mime_count + 1;
  *(int *)&config->trace_dump = easysrc_mime_count;
  CVar1 = easysrc_addf(&easysrc_decl,"curl_mime *mime%d;");
  if (CVar1 == CURLE_OK) {
    CVar1 = easysrc_addf(&easysrc_data,"mime%d = NULL;",(ulong)*(uint *)&config->trace_dump);
    if (CVar1 == CURLE_OK) {
      CVar1 = easysrc_addf(&easysrc_code,"mime%d = curl_mime_init(hnd);",
                           (ulong)*(uint *)&config->trace_dump);
      if (CVar1 == CURLE_OK) {
        CVar1 = easysrc_addf(&easysrc_clean,"curl_mime_free(mime%d);",
                             (ulong)*(uint *)&config->trace_dump);
        if (CVar1 == CURLE_OK) {
          CVar1 = easysrc_addf(&easysrc_clean,"mime%d = NULL;",(ulong)*(uint *)&config->trace_dump);
        }
      }
    }
  }
  if ((*(long *)((long)curl + 0x48) != 0) && (CVar1 == CURLE_OK)) {
    CVar1 = easysrc_addf(&easysrc_decl,"curl_mimepart *part%d;",(ulong)*(uint *)&config->trace_dump)
    ;
    if (CVar1 == CURLE_OK) {
      CVar1 = libcurl_generate_mime_part
                        (*(CURL **)((long)curl + 0x48),
                         (GlobalConfig *)(ulong)*(uint *)&config->trace_dump,part,mimeno_00);
      return CVar1;
    }
  }
  return CVar1;
}

Assistant:

static CURLcode libcurl_generate_mime(CURL *curl,
                                      struct GlobalConfig *config,
                                      struct tool_mime *toolmime,
                                      int *mimeno)
{
  CURLcode ret = CURLE_OK;

  /* May need several mime variables, so invent name. */
  *mimeno = ++easysrc_mime_count;
  ret = easysrc_addf(&easysrc_decl, "curl_mime *mime%d;", *mimeno);
  if(!ret)
    ret = easysrc_addf(&easysrc_data, "mime%d = NULL;", *mimeno);
  if(!ret)
    ret = easysrc_addf(&easysrc_code, "mime%d = curl_mime_init(hnd);",
                       *mimeno);
  if(!ret)
    ret = easysrc_addf(&easysrc_clean, "curl_mime_free(mime%d);", *mimeno);
  if(!ret)
    ret = easysrc_addf(&easysrc_clean, "mime%d = NULL;", *mimeno);

  if(toolmime->subparts && !ret) {
    ret = easysrc_addf(&easysrc_decl, "curl_mimepart *part%d;", *mimeno);
    if(!ret)
      ret = libcurl_generate_mime_part(curl, config,
                                       toolmime->subparts, *mimeno);
  }

  return ret;
}